

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char value,format_specs *specs,locale_ref loc)

{
  bool bVar1;
  basic_appender<char> bVar2;
  format_specs *in_RCX;
  format_specs *pfVar3;
  write_int_arg<unsigned_int> in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *sig;
  undefined1 in_SIL;
  write_int_arg<unsigned_int> ctx;
  write_int_arg<unsigned_int> in_RDI;
  uchar *in_R8;
  size_t in_R9;
  undefined7 in_stack_00000048;
  undefined1 in_stack_00000070 [32];
  format_specs *in_stack_ffffffffffffff28;
  uchar value_00;
  loc_value *in_stack_ffffffffffffff30;
  format_specs *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  char value_01;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  write_int_arg<unsigned_int> arg;
  basic_appender<char> in_stack_ffffffffffffff60;
  format_specs *local_48;
  
  value_01 = (char)((ulong)in_stack_ffffffffffffff40 >> 0x38);
  pfVar3 = in_RCX;
  bVar1 = check_char_specs(in_stack_ffffffffffffff28);
  value_00 = (uchar)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  if (bVar1) {
    bVar2.container._7_1_ = in_stack_ffffffffffffff4f;
    bVar2.container._0_7_ = in_stack_ffffffffffffff48;
    bVar2 = write_char<char,fmt::v11::basic_appender<char>>
                      (bVar2,value_01,in_stack_ffffffffffffff38);
    return (basic_appender<char>)bVar2.container;
  }
  pfVar3 = (format_specs *)CONCAT71((int7)((ulong)pfVar3 >> 8),in_SIL);
  ctx = in_RDI;
  arg = in_RDI;
  bVar1 = basic_specs::localized((basic_specs *)in_RDX);
  sig = extraout_RDX;
  if (bVar1) {
    loc_value::loc_value<unsigned_char,_0>(in_stack_ffffffffffffff30,value_00);
    ctx = in_RDX;
    in_stack_ffffffffffffff38 = local_48;
    bVar1 = write_loc((appender)out.container,(loc_value)in_stack_00000070,
                      (format_specs *)CONCAT17(value,in_stack_00000048),loc);
    pfVar3 = local_48;
    sig = extraout_RDX_00;
    if (bVar1) {
      return (basic_appender<char>)in_RDI;
    }
  }
  basic_specs::sign((basic_specs *)in_RDX,(EVP_PKEY_CTX *)ctx,sig,(size_t *)pfVar3,in_R8,in_R9);
  make_write_int_arg<unsigned_char>
            ((uchar)((ulong)in_stack_ffffffffffffff38 >> 0x38),(sign)in_stack_ffffffffffffff38);
  bVar2 = write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
                    (in_stack_ffffffffffffff60,arg,in_RCX);
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value, const format_specs& specs,
                         locale_ref loc = {}) -> OutputIt {
  // char is formatted as unsigned char for consistency across platforms.
  using unsigned_type =
      conditional_t<std::is_same<Char, char>::value, unsigned char, unsigned>;
  return check_char_specs(specs)
             ? write_char<Char>(out, value, specs)
             : write<Char>(out, static_cast<unsigned_type>(value), specs, loc);
}